

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O2

int ldeletereader(lua_State *L)

{
  rwlock *prVar1;
  rwlock *lock;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)lua_touserdata(L,1);
  lock = (rwlock *)*puVar2;
  rwlock_rlock(lock);
  LOCK();
  prVar1 = lock + 1;
  prVar1->write = prVar1->write + -1;
  UNLOCK();
  if (prVar1->write == 0) {
    if (lock[2] != (rwlock)0x0) {
      __assert_fail("obj->copy == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-stm.c"
                    ,0x4c,"void stm_releasereader(struct stm_object *)");
    }
    free(lock);
  }
  else {
    LOCK();
    lock->read = lock->read + -1;
    UNLOCK();
  }
  *puVar2 = 0;
  stm_releasecopy((stm_copy *)puVar2[1]);
  puVar2[1] = 0;
  return 0;
}

Assistant:

static int
ldeletereader(lua_State *L) {
	struct boxreader * box = lua_touserdata(L, 1);
	stm_releasereader(box->obj);
	box->obj = NULL;
	stm_releasecopy(box->lastcopy);
	box->lastcopy = NULL;

	return 0;
}